

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::operator=(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
            *this,vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
                  *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar4;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar5;
  undefined8 uVar6;
  size_t sVar7;
  bool *pbVar8;
  long lVar9;
  size_t sVar10;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar4 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar4;
      sVar7 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar7;
      sVar7 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar7;
    }
    else {
      sVar7 = this->nStored;
      if (sVar7 != 0) {
        pbVar8 = &this->ptr->set;
        do {
          if (*pbVar8 == true) {
            *pbVar8 = false;
          }
          pbVar8 = pbVar8 + 0x18;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      sVar7 = other->nStored;
      if (sVar7 != 0) {
        poVar4 = this->ptr;
        poVar5 = other->ptr;
        lVar9 = 0;
        sVar10 = sVar7;
        do {
          bVar3 = (&poVar5->set)[lVar9];
          (&poVar4->set)[lVar9] = bVar3;
          if (bVar3 == true) {
            *(undefined8 *)((long)&poVar4->optionalValue + lVar9) = 0;
            puVar1 = (undefined8 *)((long)&poVar5->optionalValue + lVar9);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)&poVar4->optionalValue + lVar9);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            (&poVar5->set)[lVar9] = false;
          }
          lVar9 = lVar9 + 0x18;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
      }
      this->nStored = sVar7;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }